

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiDisplayTimingTests.cpp
# Opt level: O0

void __thiscall
vkt::wsi::anon_unknown_0::DisplayTimingTestInstance::DisplayTimingTestInstance
          (DisplayTimingTestInstance *this,Context *context,TestConfig *testConfig)

{
  Type wsiType;
  VkInstance pVVar1;
  VkDevice pVVar2;
  PtrData<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_> data;
  PtrData<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_> data_00;
  RefData<vk::VkInstance_s_*> data_01;
  RefData<vk::VkDevice_s_*> data_02;
  RefData<vk::Handle<(vk::HandleType)25>_> data_03;
  RefData<vk::Handle<(vk::HandleType)24>_> data_04;
  RefData<vk::Handle<(vk::HandleType)14>_> data_05;
  RefData<vk::Handle<(vk::HandleType)14>_> data_06;
  RefData<vk::Handle<(vk::HandleType)16>_> data_07;
  int iVar3;
  deUint32 dVar4;
  PlatformInterface *pPVar5;
  VkInstance_s **ppVVar6;
  TestContext *pTVar7;
  CommandLine *cmdLine;
  VkPhysicalDevice pVVar8;
  Platform *pPVar9;
  undefined4 extraout_var;
  Display *pDVar10;
  Window *nativeWindow;
  Handle<(vk::HandleType)25> *pHVar11;
  VkDevice_s **ppVVar12;
  VkQueue pVVar13;
  ProgramCollection<vk::ProgramBinary> *pPVar14;
  ProgramBinary *pPVar15;
  TestLog *pTVar16;
  MessageBuilder *this_01;
  undefined4 uVar17;
  undefined4 uVar18;
  MessageBuilder local_470;
  allocator<char> local_2e9;
  string local_2e8;
  allocator<char> local_2c1;
  string local_2c0;
  ScopedLogSection local_2a0;
  ScopedLogSection surfaceInfo;
  Move<vk::Handle<(vk::HandleType)16>_> local_278;
  RefData<vk::Handle<(vk::HandleType)16>_> local_258;
  allocator<char> local_231;
  string local_230;
  Move<vk::Handle<(vk::HandleType)14>_> local_210;
  RefData<vk::Handle<(vk::HandleType)14>_> local_1f0;
  allocator<char> local_1c9;
  string local_1c8;
  Move<vk::Handle<(vk::HandleType)14>_> local_1a8;
  RefData<vk::Handle<(vk::HandleType)14>_> local_188;
  Move<vk::Handle<(vk::HandleType)24>_> local_168;
  RefData<vk::Handle<(vk::HandleType)24>_> local_148;
  Move<vk::VkDevice_s_*> local_128;
  RefData<vk::VkDevice_s_*> local_110;
  deUint64 local_f8;
  Move<vk::Handle<(vk::HandleType)25>_> local_f0;
  RefData<vk::Handle<(vk::HandleType)25>_> local_d0;
  Maybe<tcu::Vector<unsigned_int,_2>_> local_b0;
  PtrData<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_> local_a0;
  PtrData<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_> *local_90;
  PtrData<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_> local_80;
  PtrData<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_> *local_70;
  Move<vk::VkInstance_s_*> local_60;
  RefData<vk::VkInstance_s_*> local_48;
  TestConfig *local_20;
  TestConfig *testConfig_local;
  Context *context_local;
  DisplayTimingTestInstance *this_local;
  MovePtr *this_00;
  
  local_20 = testConfig;
  testConfig_local = (TestConfig *)context;
  context_local = (Context *)this;
  TestInstance::TestInstance(&this->super_TestInstance,context);
  (this->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__DisplayTimingTestInstance_0166c910;
  this->m_useDisplayTiming = (bool)(local_20->useDisplayTiming & 1);
  this->m_quadCount = 0x10;
  pPVar5 = Context::getPlatformInterface((Context *)testConfig_local);
  this->m_vkp = pPVar5;
  ::vk::enumerateInstanceExtensionProperties(&this->m_instanceExtensions,this->m_vkp,(char *)0x0);
  createInstanceWithWsi(&local_60,this->m_vkp,&this->m_instanceExtensions,local_20->wsiType);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_48,(Move *)&local_60);
  uVar17 = SUB84(local_48.object,0);
  uVar18 = (undefined4)((ulong)local_48.object >> 0x20);
  data_01.deleter.m_destroyInstance = local_48.deleter.m_destroyInstance;
  data_01.object = local_48.object;
  data_01.deleter.m_allocator = local_48.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::VkInstance_s_*>::Unique(&this->m_instance,data_01);
  ::vk::refdetails::Move<vk::VkInstance_s_*>::~Move(&local_60);
  pPVar5 = this->m_vkp;
  ppVVar6 = ::vk::refdetails::RefBase<vk::VkInstance_s_*>::operator*
                      (&(this->m_instance).super_RefBase<vk::VkInstance_s_*>);
  ::vk::InstanceDriver::InstanceDriver(&this->m_vki,pPVar5,*ppVVar6);
  ppVVar6 = ::vk::refdetails::RefBase<vk::VkInstance_s_*>::operator*
                      (&(this->m_instance).super_RefBase<vk::VkInstance_s_*>);
  pVVar1 = *ppVVar6;
  pTVar7 = Context::getTestContext((Context *)testConfig_local);
  cmdLine = tcu::TestContext::getCommandLine(pTVar7);
  pVVar8 = ::vk::chooseDevice(&(this->m_vki).super_InstanceInterface,pVVar1,cmdLine);
  this->m_physicalDevice = pVVar8;
  pTVar7 = Context::getTestContext((Context *)testConfig_local);
  pPVar9 = tcu::TestContext::getPlatform(pTVar7);
  iVar3 = (*pPVar9->_vptr_Platform[5])();
  this_00 = (MovePtr *)CONCAT44(extraout_var,iVar3);
  createDisplay((MovePtr<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_> *)&local_80,
                (Platform *)this_00,&this->m_instanceExtensions,local_20->wsiType);
  local_70 = de::details::MovePtr::operator_cast_to_PtrData(&local_80,this_00);
  data.ptr._4_4_ = uVar18;
  data.ptr._0_4_ = uVar17;
  data._8_8_ = local_48.deleter.m_destroyInstance;
  de::details::UniquePtr<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>::UniquePtr
            (&this->m_nativeDisplay,data);
  de::details::MovePtr<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>::~MovePtr
            ((MovePtr<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_> *)&local_80);
  pDVar10 = de::details::UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>::
            operator*(&(this->m_nativeDisplay).
                       super_UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>);
  tcu::nothing<tcu::Vector<unsigned_int,2>>();
  createWindow((MovePtr<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_> *)&local_a0,pDVar10,
               &local_b0);
  local_90 = de::details::MovePtr::operator_cast_to_PtrData(&local_a0,(MovePtr *)pDVar10);
  data_00.ptr._4_4_ = uVar18;
  data_00.ptr._0_4_ = uVar17;
  data_00._8_8_ = local_48.deleter.m_destroyInstance;
  de::details::UniquePtr<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>::UniquePtr
            (&this->m_nativeWindow,data_00);
  de::details::MovePtr<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>::~MovePtr
            ((MovePtr<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_> *)&local_a0);
  tcu::Maybe<tcu::Vector<unsigned_int,_2>_>::~Maybe(&local_b0);
  ppVVar6 = ::vk::refdetails::RefBase<vk::VkInstance_s_*>::operator*
                      (&(this->m_instance).super_RefBase<vk::VkInstance_s_*>);
  pVVar1 = *ppVVar6;
  wsiType = local_20->wsiType;
  pDVar10 = de::details::UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>::
            operator*(&(this->m_nativeDisplay).
                       super_UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>);
  nativeWindow = de::details::UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>::
                 operator*(&(this->m_nativeWindow).
                            super_UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>)
  ;
  ::vk::wsi::createSurface
            (&local_f0,&(this->m_vki).super_InstanceInterface,pVVar1,wsiType,pDVar10,nativeWindow,
             (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_d0,(Move *)&local_f0);
  data_03.deleter.m_instanceIface = local_d0.deleter.m_instanceIface;
  data_03.object.m_internal = local_d0.object.m_internal;
  data_03.deleter.m_instance = local_d0.deleter.m_instance;
  data_03.deleter.m_allocator = local_d0.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)25>_>::Unique(&this->m_surface,data_03);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)25>_>::~Move(&local_f0);
  pVVar8 = this->m_physicalDevice;
  pHVar11 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)25>_>::operator*
                      (&(this->m_surface).super_RefBase<vk::Handle<(vk::HandleType)25>_>);
  local_f8 = pHVar11->m_internal;
  dVar4 = chooseQueueFamilyIndex
                    (&(this->m_vki).super_InstanceInterface,pVVar8,(VkSurfaceKHR)local_f8);
  this->m_queueFamilyIndex = dVar4;
  ::vk::enumerateDeviceExtensionProperties
            (&this->m_deviceExtensions,&(this->m_vki).super_InstanceInterface,this->m_physicalDevice
             ,(char *)0x0);
  createDeviceWithWsi(&local_128,&(this->m_vki).super_InstanceInterface,this->m_physicalDevice,
                      &this->m_deviceExtensions,this->m_queueFamilyIndex,
                      (bool)(local_20->useDisplayTiming & 1),(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_110,(Move *)&local_128);
  data_02.deleter.m_destroyDevice = local_110.deleter.m_destroyDevice;
  data_02.object = local_110.object;
  data_02.deleter.m_allocator = local_110.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::VkDevice_s_*>::Unique(&this->m_device,data_02);
  ::vk::refdetails::Move<vk::VkDevice_s_*>::~Move(&local_128);
  ppVVar12 = ::vk::refdetails::RefBase<vk::VkDevice_s_*>::operator*
                       (&(this->m_device).super_RefBase<vk::VkDevice_s_*>);
  ::vk::DeviceDriver::DeviceDriver(&this->m_vkd,&(this->m_vki).super_InstanceInterface,*ppVVar12);
  ppVVar12 = ::vk::refdetails::RefBase<vk::VkDevice_s_*>::operator*
                       (&(this->m_device).super_RefBase<vk::VkDevice_s_*>);
  pVVar13 = ::vk::getDeviceQueue
                      (&(this->m_vkd).super_DeviceInterface,*ppVVar12,this->m_queueFamilyIndex,0);
  this->m_queue = pVVar13;
  ppVVar12 = ::vk::refdetails::RefBase<vk::VkDevice_s_*>::operator*
                       (&(this->m_device).super_RefBase<vk::VkDevice_s_*>);
  createCommandPool(&local_168,&(this->m_vkd).super_DeviceInterface,*ppVVar12,
                    this->m_queueFamilyIndex);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_148,(Move *)&local_168);
  data_04.deleter.m_deviceIface = local_148.deleter.m_deviceIface;
  data_04.object.m_internal = local_148.object.m_internal;
  data_04.deleter.m_device = local_148.deleter.m_device;
  data_04.deleter.m_allocator = local_148.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::Unique(&this->m_commandPool,data_04);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move(&local_168);
  ppVVar12 = ::vk::refdetails::RefBase<vk::VkDevice_s_*>::operator*
                       (&(this->m_device).super_RefBase<vk::VkDevice_s_*>);
  pVVar2 = *ppVVar12;
  pPVar14 = Context::getBinaryCollection((Context *)testConfig_local);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"quad-vert",&local_1c9);
  pPVar15 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar14,&local_1c8);
  ::vk::createShaderModule(&local_1a8,&(this->m_vkd).super_DeviceInterface,pVVar2,pPVar15,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_188,(Move *)&local_1a8);
  data_05.deleter.m_deviceIface = local_188.deleter.m_deviceIface;
  data_05.object.m_internal = local_188.object.m_internal;
  data_05.deleter.m_device = local_188.deleter.m_device;
  data_05.deleter.m_allocator = local_188.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique
            (&this->m_vertexShaderModule,data_05);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_1a8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  ppVVar12 = ::vk::refdetails::RefBase<vk::VkDevice_s_*>::operator*
                       (&(this->m_device).super_RefBase<vk::VkDevice_s_*>);
  pVVar2 = *ppVVar12;
  pPVar14 = Context::getBinaryCollection((Context *)testConfig_local);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_230,"quad-frag",&local_231);
  pPVar15 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar14,&local_230);
  ::vk::createShaderModule(&local_210,&(this->m_vkd).super_DeviceInterface,pVVar2,pPVar15,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_1f0,(Move *)&local_210);
  data_06.deleter.m_deviceIface = local_1f0.deleter.m_deviceIface;
  data_06.object.m_internal = local_1f0.object.m_internal;
  data_06.deleter.m_device = local_1f0.deleter.m_device;
  data_06.deleter.m_allocator = local_1f0.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique
            (&this->m_fragmentShaderModule,data_06);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_210);
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator(&local_231);
  ppVVar12 = ::vk::refdetails::RefBase<vk::VkDevice_s_*>::operator*
                       (&(this->m_device).super_RefBase<vk::VkDevice_s_*>);
  createPipelineLayout(&local_278,&(this->m_vkd).super_DeviceInterface,*ppVVar12);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_258,(Move *)&local_278);
  data_07.deleter.m_deviceIface = local_258.deleter.m_deviceIface;
  data_07.object.m_internal = local_258.object.m_internal;
  data_07.deleter.m_device = local_258.deleter.m_device;
  data_07.deleter.m_allocator = local_258.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::Unique(&this->m_pipelineLayout,data_07)
  ;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::~Move(&local_278);
  pVVar8 = this->m_physicalDevice;
  pHVar11 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)25>_>::operator*
                      (&(this->m_surface).super_RefBase<vk::Handle<(vk::HandleType)25>_>);
  ::vk::wsi::getPhysicalDeviceSurfaceCapabilities
            (&this->m_surfaceProperties,&(this->m_vki).super_InstanceInterface,pVVar8,
             (VkSurfaceKHR)pHVar11->m_internal);
  pVVar8 = this->m_physicalDevice;
  pHVar11 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)25>_>::operator*
                      (&(this->m_surface).super_RefBase<vk::Handle<(vk::HandleType)25>_>);
  ::vk::wsi::getPhysicalDeviceSurfaceFormats
            (&this->m_surfaceFormats,&(this->m_vki).super_InstanceInterface,pVVar8,
             (VkSurfaceKHR)pHVar11->m_internal);
  pVVar8 = this->m_physicalDevice;
  pHVar11 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)25>_>::operator*
                      (&(this->m_surface).super_RefBase<vk::Handle<(vk::HandleType)25>_>);
  ::vk::wsi::getPhysicalDeviceSurfacePresentModes
            (&this->m_presentModes,&(this->m_vki).super_InstanceInterface,pVVar8,
             (VkSurfaceKHR)pHVar11->m_internal);
  tcu::ResultCollector::ResultCollector(&this->m_resultCollector);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)26>_>::Move(&this->m_swapchain);
  std::vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>::
  vector(&this->m_swapchainImages);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)17>_>::Move(&this->m_renderPass);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::Move(&this->m_pipeline);
  std::vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>::
  vector(&this->m_swapchainImageViews);
  std::vector<vk::Handle<(vk::HandleType)23>,_std::allocator<vk::Handle<(vk::HandleType)23>_>_>::
  vector(&this->m_framebuffers);
  std::vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>::vector
            (&this->m_commandBuffers);
  std::vector<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>::
  vector(&this->m_acquireSemaphores);
  std::vector<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>::
  vector(&this->m_renderSemaphores);
  std::vector<vk::Handle<(vk::HandleType)6>,_std::allocator<vk::Handle<(vk::HandleType)6>_>_>::
  vector(&this->m_fences);
  ::vk::Handle<(vk::HandleType)4>::Handle(&this->m_freeAcquireSemaphore,0);
  ::vk::Handle<(vk::HandleType)4>::Handle(&this->m_freeRenderSemaphore,0);
  pHVar11 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)25>_>::operator*
                      (&(this->m_surface).super_RefBase<vk::Handle<(vk::HandleType)25>_>);
  surfaceInfo.m_log = (TestLog *)pHVar11->m_internal;
  createSwapchainConfig
            (&this->m_swapchainConfig,(VkSurfaceKHR)surfaceInfo.m_log,this->m_queueFamilyIndex,
             &this->m_surfaceProperties,&this->m_surfaceFormats,&this->m_presentModes,
             local_20->presentMode);
  this->m_frameCount = 300;
  this->m_frameNdx = 0;
  this->m_maxOutOfDateCount = 0x14;
  this->m_outOfDateCount = 0;
  std::
  map<unsigned_int,_unsigned_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
  ::map(&this->m_queuePresentTimes);
  this->m_ExpectImage80Late = false;
  pTVar7 = Context::getTestContext((this->super_TestInstance).m_context);
  pTVar16 = tcu::TestContext::getLog(pTVar7);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2c0,"SurfaceCapabilities",&local_2c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e8,"SurfaceCapabilities",&local_2e9);
  tcu::ScopedLogSection::ScopedLogSection(&local_2a0,pTVar16,&local_2c0,&local_2e8);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::allocator<char>::~allocator(&local_2e9);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::allocator<char>::~allocator(&local_2c1);
  pTVar7 = Context::getTestContext((this->super_TestInstance).m_context);
  pTVar16 = tcu::TestContext::getLog(pTVar7);
  tcu::TestLog::operator<<(&local_470,pTVar16,(BeginMessageToken *)&tcu::TestLog::Message);
  this_01 = tcu::MessageBuilder::operator<<(&local_470,&this->m_surfaceProperties);
  tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_470);
  tcu::ScopedLogSection::~ScopedLogSection(&local_2a0);
  return;
}

Assistant:

DisplayTimingTestInstance::DisplayTimingTestInstance (Context& context, const TestConfig& testConfig)
	: TestInstance				(context)
	, m_useDisplayTiming		(testConfig.useDisplayTiming)
	, m_quadCount				(16u)
	, m_vkp						(context.getPlatformInterface())
	, m_instanceExtensions		(vk::enumerateInstanceExtensionProperties(m_vkp, DE_NULL))
	, m_instance				(createInstanceWithWsi(m_vkp, m_instanceExtensions, testConfig.wsiType))
	, m_vki						(m_vkp, *m_instance)
	, m_physicalDevice			(vk::chooseDevice(m_vki, *m_instance, context.getTestContext().getCommandLine()))
	, m_nativeDisplay			(createDisplay(context.getTestContext().getPlatform().getVulkanPlatform(), m_instanceExtensions, testConfig.wsiType))
	, m_nativeWindow			(createWindow(*m_nativeDisplay, tcu::nothing<UVec2>()))
	, m_surface					(vk::wsi::createSurface(m_vki, *m_instance, testConfig.wsiType, *m_nativeDisplay, *m_nativeWindow))

	, m_queueFamilyIndex		(chooseQueueFamilyIndex(m_vki, m_physicalDevice, *m_surface))
	, m_deviceExtensions		(vk::enumerateDeviceExtensionProperties(m_vki, m_physicalDevice, DE_NULL))
	, m_device					(createDeviceWithWsi(m_vki, m_physicalDevice, m_deviceExtensions, m_queueFamilyIndex, testConfig.useDisplayTiming))
	, m_vkd						(m_vki, *m_device)
	, m_queue					(getDeviceQueue(m_vkd, *m_device, m_queueFamilyIndex, 0u))

	, m_commandPool				(createCommandPool(m_vkd, *m_device, m_queueFamilyIndex))
	, m_vertexShaderModule		(vk::createShaderModule(m_vkd, *m_device, context.getBinaryCollection().get("quad-vert"), 0u))
	, m_fragmentShaderModule	(vk::createShaderModule(m_vkd, *m_device, context.getBinaryCollection().get("quad-frag"), 0u))
	, m_pipelineLayout			(createPipelineLayout(m_vkd, *m_device))

	, m_surfaceProperties		(vk::wsi::getPhysicalDeviceSurfaceCapabilities(m_vki, m_physicalDevice, *m_surface))
	, m_surfaceFormats			(vk::wsi::getPhysicalDeviceSurfaceFormats(m_vki, m_physicalDevice, *m_surface))
	, m_presentModes			(vk::wsi::getPhysicalDeviceSurfacePresentModes(m_vki, m_physicalDevice, *m_surface))

	, m_freeAcquireSemaphore	((vk::VkSemaphore)0)
	, m_freeRenderSemaphore		((vk::VkSemaphore)0)

	, m_swapchainConfig			(createSwapchainConfig(*m_surface, m_queueFamilyIndex, m_surfaceProperties, m_surfaceFormats, m_presentModes, testConfig.presentMode))

	, m_frameCount				(60u * 5u)
	, m_frameNdx				(0u)

	, m_maxOutOfDateCount		(20u)
	, m_outOfDateCount			(0u)
	, m_ExpectImage80Late		(false)
{
	{
		const tcu::ScopedLogSection surfaceInfo (m_context.getTestContext().getLog(), "SurfaceCapabilities", "SurfaceCapabilities");
		m_context.getTestContext().getLog() << TestLog::Message << m_surfaceProperties << TestLog::EndMessage;
	}
}